

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_parse.cpp
# Opt level: O2

int ParseFlagExpressionString(FScanner *sc,FParseValue *vals)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  
  bVar1 = FScanner::CheckNumber(sc);
  if (bVar1) {
    FScanner::MustGetNumber(sc);
    uVar4 = sc->Number;
  }
  else {
    bVar1 = FScanner::CheckString(sc,"(");
    uVar4 = 0;
    do {
      FScanner::MustGetString(sc);
      iVar3 = FScanner::MustMatchString(sc,&vals->Name,0x10);
      uVar4 = uVar4 | vals[iVar3].Flag;
      bVar2 = FScanner::CheckString(sc,"|");
    } while (bVar2);
    if (bVar1) {
      FScanner::MustGetStringName(sc,")");
    }
  }
  return uVar4;
}

Assistant:

int ParseFlagExpressionString(FScanner &sc, const FParseValue *vals)
{
	// May be given flags by number...
	if (sc.CheckNumber())
	{
		sc.MustGetNumber();
		return sc.Number;
	}

	// ... else should be flags by name.
	// NOTE: Later this should be removed and a normal expression used.
	// The current DECORATE parser can't handle this though.
	bool gotparen = sc.CheckString("(");
	int style = 0;
	do
	{
		sc.MustGetString();
		style |= vals[sc.MustMatchString(&vals->Name, sizeof (*vals))].Flag;
	}
	while (sc.CheckString("|"));
	if (gotparen)
	{
		sc.MustGetStringName(")");
	}

	return style;
}